

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void processERR(UA_Server *server,UA_Connection *connection,UA_ByteString *msg,size_t *offset)

{
  UA_Logger logger;
  UA_StatusCode UVar1;
  char *pcVar2;
  undefined1 local_40 [8];
  UA_TcpErrorMessage errorMessage;
  size_t *offset_local;
  UA_ByteString *msg_local;
  UA_Connection *connection_local;
  UA_Server *server_local;
  
  errorMessage.reason.data = (UA_Byte *)offset;
  UVar1 = UA_TcpErrorMessage_decodeBinary(msg,offset,(UA_TcpErrorMessage *)local_40);
  if (UVar1 == 0) {
    logger = (server->config).logger;
    pcVar2 = UA_StatusCode_name(local_40._0_4_);
    UA_LOG_ERROR(logger,UA_LOGCATEGORY_NETWORK,"Client replied with an error message: %s %.*s",
                 pcVar2,errorMessage._0_8_,errorMessage.reason.length);
  }
  else {
    (*connection->close)(connection);
  }
  return;
}

Assistant:

static void processERR(UA_Server *server, UA_Connection *connection, const UA_ByteString *msg, size_t *offset) {
    UA_TcpErrorMessage errorMessage;
    if (UA_TcpErrorMessage_decodeBinary(msg, offset, &errorMessage) != UA_STATUSCODE_GOOD) {
        connection->close(connection);
        return;
    }

    UA_LOG_ERROR(server->config.logger, UA_LOGCATEGORY_NETWORK,
                 "Client replied with an error message: %s %.*s",
                 UA_StatusCode_name(errorMessage.error), errorMessage.reason.length, errorMessage.reason.data);
}